

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

int32_t __thiscall
icu_63::Calendar::newestStamp
          (Calendar *this,UCalendarDateFields first,UCalendarDateFields last,int32_t bestStampSoFar)

{
  int32_t bestStamp;
  int32_t i;
  long lVar1;
  
  if ((int)first <= (int)last) {
    lVar1 = 0;
    do {
      if (bestStampSoFar < this->fStamp[(int)first + lVar1]) {
        bestStampSoFar = this->fStamp[(int)first + lVar1];
      }
      lVar1 = lVar1 + 1;
    } while ((last - first) + 1 != (int)lVar1);
  }
  return bestStampSoFar;
}

Assistant:

int32_t Calendar::newestStamp(UCalendarDateFields first, UCalendarDateFields last, int32_t bestStampSoFar) const
{
    int32_t bestStamp = bestStampSoFar;
    for (int32_t i=(int32_t)first; i<=(int32_t)last; ++i) {
        if (fStamp[i] > bestStamp) {
            bestStamp = fStamp[i];
        }
    }
    return bestStamp;
}